

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O1

int PixarLogDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  uint8_t *puVar8;
  bool bVar9;
  long lVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  int iVar16;
  ushort *puVar17;
  ulong uVar18;
  char *pcVar19;
  uint16_t *wp;
  int iVar20;
  long lVar21;
  ushort uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ushort uVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 *puVar30;
  ushort *puVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  ushort *puVar36;
  long lVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  
  puVar8 = tif->tif_data;
  uVar23 = *(uint *)(puVar8 + 0x108);
  if (uVar23 - 2 < 3) {
    occ = (ulong)occ >> 1;
  }
  else if (1 < uVar23) {
    if (uVar23 != 5) {
      uVar11 = (tif->tif_dir).td_bitspersample;
      pcVar19 = "%u bit input not supported in PixarLog";
LAB_002b0d35:
      TIFFErrorExtR(tif,"PixarLogDecode",pcVar19,(ulong)uVar11);
      return 0;
    }
    occ = (ulong)occ >> 2;
  }
  if (puVar8 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_pixarlog.c"
                  ,0x364,"int PixarLogDecode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  iVar20 = (uint)*(ushort *)(puVar8 + 0x100) * (tif->tif_dir).td_imagewidth;
  *(uint8_t **)(puVar8 + 0x80) = tif->tif_rawcp;
  *(int *)(puVar8 + 0x88) = (int)tif->tif_rawcc;
  *(undefined8 *)(puVar8 + 0x98) = *(undefined8 *)(puVar8 + 0xf8);
  uVar26 = occ * 2;
  *(int *)(puVar8 + 0xa0) = (int)uVar26;
  if ((uVar26 & 0xffffffff) == uVar26) {
    if ((long)(uVar26 & 0xffffffff) <= *(long *)(puVar8 + 0xf0)) {
      do {
        iVar12 = inflate((z_streamp)(puVar8 + 0x80),1);
        if (iVar12 == 1) {
          iVar12 = 3;
        }
        else if (iVar12 == 0) {
          iVar12 = 0;
        }
        else {
          if (iVar12 == -3) {
            pcVar19 = *(char **)(puVar8 + 0xb0);
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "(null)";
            }
            TIFFErrorExtR(tif,"PixarLogDecode","Decoding error at scanline %u, %s",
                          (ulong)tif->tif_row,pcVar19);
          }
          else {
            pcVar19 = *(char **)(puVar8 + 0xb0);
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "(null)";
            }
            TIFFErrorExtR(tif,"PixarLogDecode","ZLib error: %s",pcVar19);
          }
          iVar12 = 1;
        }
        if (iVar12 != 0) {
          if (iVar12 != 3) {
            return 0;
          }
          break;
        }
      } while (*(int *)(puVar8 + 0xa0) != 0);
      if (*(int *)(puVar8 + 0xa0) != 0) {
        TIFFErrorExtR(tif,"PixarLogDecode","Not enough data at scanline %u (short %u bytes)",
                      (ulong)tif->tif_row);
        return 0;
      }
      tif->tif_rawcp = *(uint8_t **)(puVar8 + 0x80);
      tif->tif_rawcc = (ulong)*(uint *)(puVar8 + 0x88);
      wp = *(uint16_t **)(puVar8 + 0xf8);
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabArrayOfShort(wp,occ);
      }
      lVar21 = (long)iVar20;
      if (occ % lVar21 != 0) {
        TIFFWarningExtR(tif,"PixarLogDecode",
                        "stride %d is not a multiple of sample count, %ld, data truncated.");
        occ = occ - occ % lVar21;
      }
      if (0 < occ) {
        lVar10 = lVar21 * 2;
        lVar1 = lVar21 * 4;
        iVar12 = iVar20 + 4;
        puVar17 = wp + 5;
        iVar13 = iVar20 + 3;
        lVar25 = 0;
        do {
          lVar14 = lVar21;
          switch(*(undefined4 *)(puVar8 + 0x108)) {
          case 0:
            uVar11 = *(ushort *)(puVar8 + 0x100);
            if ((int)(uint)uVar11 <= iVar20) {
              lVar35 = *(long *)(puVar8 + 0x130);
              uVar23 = (uint)uVar11;
              if (uVar23 == 3) {
                uVar24 = (ulong)*wp & 0x7ff;
                *op = *(undefined1 *)(lVar35 + uVar24);
                uVar18 = (ulong)wp[1] & 0x7ff;
                *(undefined1 *)((long)op + 1) = *(undefined1 *)(lVar35 + uVar18);
                uVar26 = (ulong)wp[2] & 0x7ff;
                *(undefined1 *)((long)op + 2) = *(undefined1 *)(lVar35 + uVar26);
                if (3 < iVar20) {
                  lVar37 = 5;
                  iVar32 = iVar13;
                  do {
                    uVar23 = (int)uVar24 + (uint)wp[lVar37 + -2];
                    uVar24 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37 + -2) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar18 + (uint)wp[lVar37 + -1];
                    uVar18 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37 + -1) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar26 + (uint)wp[lVar37];
                    uVar26 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    lVar37 = lVar37 + 3;
                    iVar32 = iVar32 + -3;
                  } while (6 < iVar32);
                }
              }
              else if (uVar23 == 4) {
                uVar29 = (ulong)*wp & 0x7ff;
                *op = *(undefined1 *)(lVar35 + uVar29);
                uVar24 = (ulong)wp[1] & 0x7ff;
                *(undefined1 *)((long)op + 1) = *(undefined1 *)(lVar35 + uVar24);
                uVar18 = (ulong)wp[2] & 0x7ff;
                *(undefined1 *)((long)op + 2) = *(undefined1 *)(lVar35 + uVar18);
                uVar26 = (ulong)wp[3] & 0x7ff;
                *(undefined1 *)((long)op + 3) = *(undefined1 *)(lVar35 + uVar26);
                if (4 < iVar20) {
                  lVar37 = 7;
                  iVar32 = iVar12;
                  do {
                    uVar23 = (int)uVar29 + (uint)wp[lVar37 + -3];
                    uVar29 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37 + -3) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar24 + (uint)wp[lVar37 + -2];
                    uVar24 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37 + -2) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar18 + (uint)wp[lVar37 + -1];
                    uVar18 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37 + -1) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar26 + (uint)wp[lVar37];
                    uVar26 = (ulong)uVar23;
                    *(undefined1 *)((long)op + lVar37) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    lVar37 = lVar37 + 4;
                    iVar32 = iVar32 + -4;
                  } while (8 < iVar32);
                }
              }
              else {
                iVar16 = uVar11 + 1;
                puVar31 = (ushort *)op;
                puVar36 = wp;
                iVar32 = iVar16;
                do {
                  *(undefined1 *)puVar31 = *(undefined1 *)(lVar35 + (ulong)(*puVar36 & 0x7ff));
                  puVar36 = puVar36 + 1;
                  puVar31 = (ushort *)((long)puVar31 + 1);
                  iVar32 = iVar32 + -1;
                } while (1 < iVar32);
                if (iVar20 - uVar23 != 0 && (int)uVar23 <= iVar20) {
                  iVar32 = iVar16;
                  iVar33 = iVar20 - uVar23;
                  do {
                    do {
                      puVar36[uVar11] = puVar36[uVar11] + *puVar36;
                      *(undefined1 *)puVar31 = *(undefined1 *)(lVar35 + (ulong)(*puVar36 & 0x7ff));
                      puVar36 = puVar36 + 1;
                      puVar31 = (ushort *)((long)puVar31 + 1);
                      iVar32 = iVar32 + -1;
                    } while (1 < iVar32);
                    iVar34 = iVar33 - (uint)uVar11;
                    bVar9 = (int)(uint)uVar11 <= iVar33;
                    iVar32 = iVar16;
                    iVar33 = iVar34;
                  } while (iVar34 != 0 && bVar9);
                }
              }
            }
            break;
          case 1:
            uVar11 = *(ushort *)(puVar8 + 0x100);
            if ((int)(uint)uVar11 <= iVar20) {
              lVar35 = *(long *)(puVar8 + 0x130);
              uVar23 = (uint)uVar11;
              if (uVar23 == 3) {
                *op = 0;
                uVar24 = (ulong)wp[2] & 0x7ff;
                uVar18 = (ulong)wp[1] & 0x7ff;
                uVar26 = (ulong)*wp & 0x7ff;
                uVar5 = *(undefined1 *)(lVar35 + uVar18);
                uVar6 = *(undefined1 *)(lVar35 + uVar26);
                *(undefined1 *)((long)op + 1) = *(undefined1 *)(lVar35 + uVar24);
                *(undefined1 *)((long)op + 2) = uVar5;
                *(undefined1 *)((long)op + 3) = uVar6;
                if (3 < iVar20) {
                  puVar30 = (undefined1 *)((long)op + 7);
                  puVar31 = puVar17;
                  iVar32 = iVar13;
                  do {
                    puVar30[-3] = 0;
                    uVar28 = (int)uVar24 + (uint)*puVar31;
                    uVar24 = (ulong)uVar28;
                    uVar23 = (int)uVar18 + (uint)puVar31[-1];
                    uVar18 = (ulong)uVar23;
                    uVar5 = *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar26 + (uint)puVar31[-2];
                    uVar26 = (ulong)uVar23;
                    uVar6 = *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    puVar30[-2] = *(undefined1 *)(lVar35 + (ulong)(uVar28 & 0x7ff));
                    puVar30[-1] = uVar5;
                    *puVar30 = uVar6;
                    puVar31 = puVar31 + 3;
                    iVar32 = iVar32 + -3;
                    puVar30 = puVar30 + 4;
                  } while (6 < iVar32);
                }
              }
              else if (uVar23 == 4) {
                uVar29 = (ulong)wp[3] & 0x7ff;
                uVar24 = (ulong)wp[2] & 0x7ff;
                uVar18 = (ulong)wp[1] & 0x7ff;
                uVar26 = (ulong)*wp & 0x7ff;
                uVar5 = *(undefined1 *)(lVar35 + uVar24);
                uVar6 = *(undefined1 *)(lVar35 + uVar18);
                uVar7 = *(undefined1 *)(lVar35 + uVar26);
                *op = *(undefined1 *)(lVar35 + uVar29);
                *(undefined1 *)((long)op + 1) = uVar5;
                *(undefined1 *)((long)op + 2) = uVar6;
                *(undefined1 *)((long)op + 3) = uVar7;
                if (4 < iVar20) {
                  lVar37 = 7;
                  iVar32 = iVar12;
                  do {
                    uVar28 = (int)uVar29 + (uint)wp[lVar37];
                    uVar29 = (ulong)uVar28;
                    uVar23 = (int)uVar24 + (uint)wp[lVar37 + -1];
                    uVar24 = (ulong)uVar23;
                    uVar5 = *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar18 + (uint)wp[lVar37 + -2];
                    uVar18 = (ulong)uVar23;
                    uVar6 = *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    uVar23 = (int)uVar26 + (uint)wp[lVar37 + -3];
                    uVar26 = (ulong)uVar23;
                    uVar7 = *(undefined1 *)(lVar35 + (ulong)(uVar23 & 0x7ff));
                    *(undefined1 *)((long)op + lVar37 + -3) =
                         *(undefined1 *)(lVar35 + (ulong)(uVar28 & 0x7ff));
                    *(undefined1 *)((long)op + lVar37 + -2) = uVar5;
                    *(undefined1 *)((long)op + lVar37 + -1) = uVar6;
                    *(undefined1 *)((long)op + lVar37) = uVar7;
                    lVar37 = lVar37 + 4;
                    iVar32 = iVar32 + -4;
                  } while (8 < iVar32);
                }
              }
              else {
                iVar16 = uVar11 + 1;
                puVar31 = (ushort *)op;
                puVar36 = wp;
                iVar32 = iVar16;
                do {
                  *(undefined1 *)puVar31 = *(undefined1 *)(lVar35 + (ulong)(*puVar36 & 0x7ff));
                  puVar36 = puVar36 + 1;
                  puVar31 = (ushort *)((long)puVar31 + 1);
                  iVar32 = iVar32 + -1;
                } while (1 < iVar32);
                if (iVar20 - uVar23 != 0 && (int)uVar23 <= iVar20) {
                  iVar32 = iVar16;
                  iVar33 = iVar20 - uVar23;
                  do {
                    do {
                      puVar36[uVar11] = puVar36[uVar11] + *puVar36;
                      *(undefined1 *)puVar31 = *(undefined1 *)(lVar35 + (ulong)(*puVar36 & 0x7ff));
                      puVar36 = puVar36 + 1;
                      puVar31 = (ushort *)((long)puVar31 + 1);
                      iVar32 = iVar32 + -1;
                    } while (1 < iVar32);
                    iVar34 = iVar33 - (uint)uVar11;
                    bVar9 = (int)(uint)uVar11 <= iVar33;
                    iVar32 = iVar16;
                    iVar33 = iVar34;
                  } while (iVar34 != 0 && bVar9);
                }
              }
            }
            break;
          case 2:
            uVar11 = *(ushort *)(puVar8 + 0x100);
            lVar14 = lVar10;
            if ((int)(uint)uVar11 <= iVar20) {
              uVar23 = (uint)uVar11;
              if (uVar23 == 3) {
                *(uint16_t *)op = *wp;
                *(uint16_t *)((long)op + 2) = wp[1];
                *(uint16_t *)((long)op + 4) = wp[2];
                if (3 < iVar20) {
                  uVar11 = wp[2];
                  uVar15 = wp[1];
                  uVar22 = *wp;
                  lVar35 = 10;
                  iVar32 = iVar13;
                  do {
                    uVar22 = uVar22 + *(short *)((long)wp + lVar35 + -4);
                    *(ushort *)((long)op + lVar35 + -4) = uVar22 & 0x7ff;
                    uVar15 = uVar15 + *(short *)((long)wp + lVar35 + -2);
                    *(ushort *)((long)op + lVar35 + -2) = uVar15 & 0x7ff;
                    uVar11 = uVar11 + *(short *)((long)wp + lVar35);
                    *(ushort *)((long)op + lVar35) = uVar11 & 0x7ff;
                    lVar35 = lVar35 + 6;
                    iVar32 = iVar32 + -3;
                  } while (6 < iVar32);
                }
              }
              else if (uVar23 == 4) {
                *(uint16_t *)op = *wp;
                *(uint16_t *)((long)op + 2) = wp[1];
                *(uint16_t *)((long)op + 4) = wp[2];
                *(uint16_t *)((long)op + 6) = wp[3];
                if (4 < iVar20) {
                  uVar11 = wp[3];
                  uVar15 = wp[2];
                  uVar22 = wp[1];
                  uVar27 = *wp;
                  lVar35 = 0xe;
                  iVar32 = iVar12;
                  do {
                    uVar27 = uVar27 + *(short *)((long)wp + lVar35 + -6);
                    *(ushort *)((long)op + lVar35 + -6) = uVar27 & 0x7ff;
                    uVar22 = uVar22 + *(short *)((long)wp + lVar35 + -4);
                    *(ushort *)((long)op + lVar35 + -4) = uVar22 & 0x7ff;
                    uVar15 = uVar15 + *(short *)((long)wp + lVar35 + -2);
                    *(ushort *)((long)op + lVar35 + -2) = uVar15 & 0x7ff;
                    uVar11 = uVar11 + *(short *)((long)wp + lVar35);
                    *(ushort *)((long)op + lVar35) = uVar11 & 0x7ff;
                    lVar35 = lVar35 + 8;
                    iVar32 = iVar32 + -4;
                  } while (8 < iVar32);
                }
              }
              else {
                iVar16 = uVar11 + 1;
                puVar31 = (ushort *)op;
                puVar36 = wp;
                iVar32 = iVar16;
                do {
                  *puVar31 = *puVar36 & 0x7ff;
                  puVar36 = puVar36 + 1;
                  puVar31 = puVar31 + 1;
                  iVar32 = iVar32 + -1;
                } while (1 < iVar32);
                if (iVar20 - uVar23 != 0 && (int)uVar23 <= iVar20) {
                  iVar32 = iVar16;
                  iVar33 = iVar20 - uVar23;
                  do {
                    do {
                      puVar36[uVar11] = puVar36[uVar11] + *puVar36;
                      *puVar31 = *puVar36 & 0x7ff;
                      puVar36 = puVar36 + 1;
                      puVar31 = puVar31 + 1;
                      iVar32 = iVar32 + -1;
                    } while (1 < iVar32);
                    iVar34 = iVar33 - (uint)uVar11;
                    bVar9 = (int)(uint)uVar11 <= iVar33;
                    iVar32 = iVar16;
                    iVar33 = iVar34;
                  } while (iVar34 != 0 && bVar9);
                }
              }
            }
            break;
          case 3:
            uVar11 = *(ushort *)(puVar8 + 0x100);
            lVar14 = lVar10;
            if ((int)(uint)uVar11 <= iVar20) {
              lVar35 = *(long *)(puVar8 + 0x120);
              uVar23 = (uint)uVar11;
              if (uVar23 == 3) {
                uVar24 = (ulong)*wp & 0x7ff;
                uVar18 = (ulong)wp[1] & 0x7ff;
                uVar26 = (ulong)wp[2] & 0x7ff;
                fVar38 = *(float *)(lVar35 + uVar24 * 4) * 2048.0;
                fVar39 = *(float *)(lVar35 + uVar18 * 4) * 2048.0;
                if (3071.0 <= fVar38) {
                  fVar38 = 3071.0;
                }
                fVar40 = *(float *)(lVar35 + uVar26 * 4) * 2048.0;
                if (3071.0 <= fVar39) {
                  fVar39 = 3071.0;
                }
                *(ushort *)op = (ushort)(int)fVar38;
                if (3071.0 <= fVar40) {
                  fVar40 = 3071.0;
                }
                *(ushort *)((long)op + 2) = (ushort)(int)fVar39;
                *(ushort *)((long)op + 4) = (ushort)(int)fVar40;
                if (3 < iVar20) {
                  lVar37 = 10;
                  iVar32 = iVar13;
                  do {
                    uVar23 = (int)uVar24 + (uint)*(ushort *)((long)wp + lVar37 + -4);
                    uVar24 = (ulong)uVar23;
                    fVar38 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    uVar23 = (int)uVar18 + (uint)*(ushort *)((long)wp + lVar37 + -2);
                    uVar18 = (ulong)uVar23;
                    fVar39 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    uVar23 = (int)uVar26 + (uint)*(ushort *)((long)wp + lVar37);
                    uVar26 = (ulong)uVar23;
                    fVar40 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    if (3071.0 <= fVar38) {
                      fVar38 = 3071.0;
                    }
                    *(short *)((long)op + lVar37 + -4) = (short)(int)fVar38;
                    if (3071.0 <= fVar39) {
                      fVar39 = 3071.0;
                    }
                    *(short *)((long)op + lVar37 + -2) = (short)(int)fVar39;
                    if (3071.0 <= fVar40) {
                      fVar40 = 3071.0;
                    }
                    *(short *)((long)op + lVar37) = (short)(int)fVar40;
                    lVar37 = lVar37 + 6;
                    iVar32 = iVar32 + -3;
                  } while (6 < iVar32);
                }
              }
              else if (uVar23 == 4) {
                uVar29 = (ulong)*wp & 0x7ff;
                uVar24 = (ulong)wp[1] & 0x7ff;
                uVar18 = (ulong)wp[2] & 0x7ff;
                uVar26 = (ulong)wp[3] & 0x7ff;
                fVar38 = *(float *)(lVar35 + uVar29 * 4) * 2048.0;
                fVar39 = *(float *)(lVar35 + uVar24 * 4) * 2048.0;
                fVar40 = *(float *)(lVar35 + uVar18 * 4) * 2048.0;
                if (3071.0 <= fVar38) {
                  fVar38 = 3071.0;
                }
                fVar41 = *(float *)(lVar35 + uVar26 * 4) * 2048.0;
                if (3071.0 <= fVar39) {
                  fVar39 = 3071.0;
                }
                *(ushort *)op = (ushort)(int)fVar38;
                if (3071.0 <= fVar40) {
                  fVar40 = 3071.0;
                }
                *(ushort *)((long)op + 2) = (ushort)(int)fVar39;
                if (3071.0 <= fVar41) {
                  fVar41 = 3071.0;
                }
                *(ushort *)((long)op + 4) = (ushort)(int)fVar40;
                *(ushort *)((long)op + 6) = (ushort)(int)fVar41;
                if (4 < iVar20) {
                  lVar37 = 0xe;
                  iVar32 = iVar12;
                  do {
                    uVar23 = (int)uVar29 + (uint)*(ushort *)((long)wp + lVar37 + -6);
                    uVar29 = (ulong)uVar23;
                    fVar38 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    uVar23 = (int)uVar24 + (uint)*(ushort *)((long)wp + lVar37 + -4);
                    uVar24 = (ulong)uVar23;
                    fVar39 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    uVar23 = (int)uVar18 + (uint)*(ushort *)((long)wp + lVar37 + -2);
                    uVar18 = (ulong)uVar23;
                    fVar40 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    uVar23 = (int)uVar26 + (uint)*(ushort *)((long)wp + lVar37);
                    uVar26 = (ulong)uVar23;
                    fVar41 = *(float *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4) * 2048.0;
                    if (3071.0 <= fVar38) {
                      fVar38 = 3071.0;
                    }
                    *(short *)((long)op + lVar37 + -6) = (short)(int)fVar38;
                    if (3071.0 <= fVar39) {
                      fVar39 = 3071.0;
                    }
                    *(short *)((long)op + lVar37 + -4) = (short)(int)fVar39;
                    if (3071.0 <= fVar40) {
                      fVar40 = 3071.0;
                    }
                    *(short *)((long)op + lVar37 + -2) = (short)(int)fVar40;
                    if (3071.0 <= fVar41) {
                      fVar41 = 3071.0;
                    }
                    *(short *)((long)op + lVar37) = (short)(int)fVar41;
                    lVar37 = lVar37 + 8;
                    iVar32 = iVar32 + -4;
                  } while (8 < iVar32);
                }
              }
              else {
                iVar16 = uVar11 + 1;
                puVar31 = wp;
                puVar36 = (ushort *)op;
                iVar32 = iVar16;
                do {
                  fVar38 = *(float *)(lVar35 + (ulong)(*puVar31 & 0x7ff) * 4) * 2048.0;
                  if (3071.0 <= fVar38) {
                    fVar38 = 3071.0;
                  }
                  *puVar36 = (ushort)(int)fVar38;
                  puVar31 = puVar31 + 1;
                  puVar36 = puVar36 + 1;
                  iVar32 = iVar32 + -1;
                } while (1 < iVar32);
                if (iVar20 - uVar23 != 0 && (int)uVar23 <= iVar20) {
                  iVar32 = iVar16;
                  iVar33 = iVar20 - uVar23;
                  do {
                    uVar15 = puVar31[uVar11];
                    uVar22 = *puVar31;
                    puVar31[uVar11] = uVar15 + uVar22;
                    fVar38 = *(float *)(lVar35 + (ulong)((ushort)(uVar15 + uVar22) & 0x7ff) * 4) *
                             2048.0;
                    if (3071.0 <= fVar38) {
                      fVar38 = 3071.0;
                    }
                    *puVar36 = (ushort)(int)fVar38;
                    puVar31 = puVar31 + 1;
                    puVar36 = puVar36 + 1;
                    iVar32 = iVar32 + -1;
                  } while ((1 < iVar32) ||
                          (iVar34 = iVar33 - (uint)uVar11, bVar9 = (int)(uint)uVar11 <= iVar33,
                          iVar32 = iVar16, iVar33 = iVar34, iVar34 != 0 && bVar9));
                }
              }
            }
            break;
          case 4:
            uVar11 = *(ushort *)(puVar8 + 0x100);
            lVar14 = lVar10;
            if ((int)(uint)uVar11 <= iVar20) {
              lVar35 = *(long *)(puVar8 + 0x128);
              uVar23 = (uint)uVar11;
              if (uVar23 == 3) {
                uVar24 = (ulong)*wp & 0x7ff;
                *(ushort *)op = *(ushort *)(lVar35 + uVar24 * 2);
                uVar18 = (ulong)wp[1] & 0x7ff;
                *(ushort *)((long)op + 2) = *(ushort *)(lVar35 + uVar18 * 2);
                uVar26 = (ulong)wp[2] & 0x7ff;
                *(ushort *)((long)op + 4) = *(ushort *)(lVar35 + uVar26 * 2);
                if (3 < iVar20) {
                  lVar37 = 10;
                  iVar32 = iVar13;
                  do {
                    uVar23 = (int)uVar24 + (uint)*(ushort *)((long)wp + lVar37 + -4);
                    uVar24 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37 + -4) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    uVar23 = (int)uVar18 + (uint)*(ushort *)((long)wp + lVar37 + -2);
                    uVar18 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37 + -2) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    uVar23 = (int)uVar26 + (uint)*(ushort *)((long)wp + lVar37);
                    uVar26 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    lVar37 = lVar37 + 6;
                    iVar32 = iVar32 + -3;
                  } while (6 < iVar32);
                }
              }
              else if (uVar23 == 4) {
                uVar29 = (ulong)*wp & 0x7ff;
                *(ushort *)op = *(ushort *)(lVar35 + uVar29 * 2);
                uVar24 = (ulong)wp[1] & 0x7ff;
                *(ushort *)((long)op + 2) = *(ushort *)(lVar35 + uVar24 * 2);
                uVar18 = (ulong)wp[2] & 0x7ff;
                *(ushort *)((long)op + 4) = *(ushort *)(lVar35 + uVar18 * 2);
                uVar26 = (ulong)wp[3] & 0x7ff;
                *(ushort *)((long)op + 6) = *(ushort *)(lVar35 + uVar26 * 2);
                if (4 < iVar20) {
                  lVar37 = 0xe;
                  iVar32 = iVar12;
                  do {
                    uVar23 = (int)uVar29 + (uint)*(ushort *)((long)wp + lVar37 + -6);
                    uVar29 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37 + -6) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    uVar23 = (int)uVar24 + (uint)*(ushort *)((long)wp + lVar37 + -4);
                    uVar24 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37 + -4) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    uVar23 = (int)uVar18 + (uint)*(ushort *)((long)wp + lVar37 + -2);
                    uVar18 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37 + -2) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    uVar23 = (int)uVar26 + (uint)*(ushort *)((long)wp + lVar37);
                    uVar26 = (ulong)uVar23;
                    *(undefined2 *)((long)op + lVar37) =
                         *(undefined2 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 2);
                    lVar37 = lVar37 + 8;
                    iVar32 = iVar32 + -4;
                  } while (8 < iVar32);
                }
              }
              else {
                iVar16 = uVar11 + 1;
                puVar31 = (ushort *)op;
                puVar36 = wp;
                iVar32 = iVar16;
                do {
                  *puVar31 = *(ushort *)(lVar35 + (ulong)(*puVar36 & 0x7ff) * 2);
                  puVar36 = puVar36 + 1;
                  puVar31 = puVar31 + 1;
                  iVar32 = iVar32 + -1;
                } while (1 < iVar32);
                if (iVar20 - uVar23 != 0 && (int)uVar23 <= iVar20) {
                  iVar32 = iVar16;
                  iVar33 = iVar20 - uVar23;
                  do {
                    do {
                      puVar36[uVar11] = puVar36[uVar11] + *puVar36;
                      *puVar31 = *(ushort *)(lVar35 + (ulong)(*puVar36 & 0x7ff) * 2);
                      puVar36 = puVar36 + 1;
                      puVar31 = puVar31 + 1;
                      iVar32 = iVar32 + -1;
                    } while (1 < iVar32);
                    iVar34 = iVar33 - (uint)uVar11;
                    bVar9 = (int)(uint)uVar11 <= iVar33;
                    iVar32 = iVar16;
                    iVar33 = iVar34;
                  } while (iVar34 != 0 && bVar9);
                }
              }
            }
            break;
          case 5:
            uVar11 = *(ushort *)(puVar8 + 0x100);
            lVar14 = lVar1;
            if ((int)(uint)uVar11 <= iVar20) {
              lVar35 = *(long *)(puVar8 + 0x120);
              uVar23 = (uint)uVar11;
              if (uVar23 == 3) {
                uVar24 = (ulong)*wp & 0x7ff;
                uVar18 = (ulong)wp[1] & 0x7ff;
                uVar26 = (ulong)wp[2] & 0x7ff;
                uVar2 = *(undefined4 *)(lVar35 + uVar18 * 4);
                uVar3 = *(undefined4 *)(lVar35 + uVar26 * 4);
                *(undefined4 *)op = *(undefined4 *)(lVar35 + uVar24 * 4);
                *(undefined4 *)((long)op + 4) = uVar2;
                *(undefined4 *)((long)op + 8) = uVar3;
                if (3 < iVar20) {
                  lVar37 = 10;
                  iVar32 = iVar13;
                  do {
                    uVar28 = (int)uVar24 + (uint)*(ushort *)((long)wp + lVar37 + -4);
                    uVar24 = (ulong)uVar28;
                    uVar23 = (int)uVar18 + (uint)*(ushort *)((long)wp + lVar37 + -2);
                    uVar18 = (ulong)uVar23;
                    uVar2 = *(undefined4 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4);
                    uVar23 = (int)uVar26 + (uint)*(ushort *)((long)wp + lVar37);
                    uVar26 = (ulong)uVar23;
                    uVar3 = *(undefined4 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar37 + -4) * 2) =
                         *(undefined4 *)(lVar35 + (ulong)(uVar28 & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar37 + -2) * 2) = uVar2;
                    *(undefined4 *)((long)op + lVar37 * 2) = uVar3;
                    lVar37 = lVar37 + 6;
                    iVar32 = iVar32 + -3;
                  } while (6 < iVar32);
                }
              }
              else if (uVar23 == 4) {
                uVar29 = (ulong)*wp & 0x7ff;
                uVar24 = (ulong)wp[1] & 0x7ff;
                uVar18 = (ulong)wp[2] & 0x7ff;
                uVar26 = (ulong)wp[3] & 0x7ff;
                uVar2 = *(undefined4 *)(lVar35 + uVar24 * 4);
                uVar3 = *(undefined4 *)(lVar35 + uVar18 * 4);
                uVar4 = *(undefined4 *)(lVar35 + uVar26 * 4);
                *(undefined4 *)op = *(undefined4 *)(lVar35 + uVar29 * 4);
                *(undefined4 *)((long)op + 4) = uVar2;
                *(undefined4 *)((long)op + 8) = uVar3;
                *(undefined4 *)((long)op + 0xc) = uVar4;
                if (4 < iVar20) {
                  lVar37 = 0xe;
                  iVar32 = iVar12;
                  do {
                    uVar28 = (int)uVar29 + (uint)*(ushort *)((long)wp + lVar37 + -6);
                    uVar29 = (ulong)uVar28;
                    uVar23 = (int)uVar24 + (uint)*(ushort *)((long)wp + lVar37 + -4);
                    uVar24 = (ulong)uVar23;
                    uVar2 = *(undefined4 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4);
                    uVar23 = (int)uVar18 + (uint)*(ushort *)((long)wp + lVar37 + -2);
                    uVar18 = (ulong)uVar23;
                    uVar3 = *(undefined4 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4);
                    uVar23 = (int)uVar26 + (uint)*(ushort *)((long)wp + lVar37);
                    uVar26 = (ulong)uVar23;
                    uVar4 = *(undefined4 *)(lVar35 + (ulong)(uVar23 & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar37 + -6) * 2) =
                         *(undefined4 *)(lVar35 + (ulong)(uVar28 & 0x7ff) * 4);
                    *(undefined4 *)((long)op + (lVar37 + -4) * 2) = uVar2;
                    *(undefined4 *)((long)op + (lVar37 + -2) * 2) = uVar3;
                    *(undefined4 *)((long)op + lVar37 * 2) = uVar4;
                    lVar37 = lVar37 + 8;
                    iVar32 = iVar32 + -4;
                  } while (8 < iVar32);
                }
              }
              else {
                iVar16 = uVar11 + 1;
                puVar31 = (ushort *)op;
                puVar36 = wp;
                iVar32 = iVar16;
                do {
                  *(undefined4 *)puVar31 = *(undefined4 *)(lVar35 + (ulong)(*puVar36 & 0x7ff) * 4);
                  puVar36 = puVar36 + 1;
                  puVar31 = puVar31 + 2;
                  iVar32 = iVar32 + -1;
                } while (1 < iVar32);
                if (iVar20 - uVar23 != 0 && (int)uVar23 <= iVar20) {
                  iVar32 = iVar16;
                  iVar33 = iVar20 - uVar23;
                  do {
                    do {
                      puVar36[uVar11] = puVar36[uVar11] + *puVar36;
                      *(undefined4 *)puVar31 =
                           *(undefined4 *)(lVar35 + (ulong)(*puVar36 & 0x7ff) * 4);
                      puVar36 = puVar36 + 1;
                      puVar31 = puVar31 + 2;
                      iVar32 = iVar32 + -1;
                    } while (1 < iVar32);
                    iVar34 = iVar33 - (uint)uVar11;
                    bVar9 = (int)(uint)uVar11 <= iVar33;
                    iVar32 = iVar16;
                    iVar33 = iVar34;
                  } while (iVar34 != 0 && bVar9);
                }
              }
            }
            break;
          default:
            uVar11 = (tif->tif_dir).td_bitspersample;
            pcVar19 = "Unsupported bits/sample: %u";
            goto LAB_002b0d35;
          }
          op = (uint8_t *)((long)op + lVar14);
          lVar25 = lVar25 + lVar21;
          wp = wp + lVar21;
          puVar17 = puVar17 + lVar21;
        } while (lVar25 < occ);
      }
      return 1;
    }
    pcVar19 = "sp->stream.avail_out > sp->tbuf_size";
  }
  else {
    pcVar19 = "ZLib cannot deal with buffers this size";
  }
  TIFFErrorExtR(tif,"PixarLogDecode",pcVar19);
  return 0;
}

Assistant:

static int PixarLogDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PixarLogDecode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = DecoderState(tif);
    tmsize_t i;
    tmsize_t nsamples;
    int llen;
    uint16_t *up;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            nsamples = occ / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            nsamples = occ / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            nsamples = occ;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;

    (void)s;
    assert(sp != NULL);

    sp->stream.next_in = tif->tif_rawcp;
    sp->stream.avail_in = (uInt)tif->tif_rawcc;

    sp->stream.next_out = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_out) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_out = (uInt)(nsamples * sizeof(uint16_t));
    if (sp->stream.avail_out != nsamples * sizeof(uint16_t))
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }
    /* Check that we will not fill more than what was allocated */
    if ((tmsize_t)sp->stream.avail_out > sp->tbuf_size)
    {
        TIFFErrorExtR(tif, module, "sp->stream.avail_out > sp->tbuf_size");
        return (0);
    }
    do
    {
        int state = inflate(&sp->stream, Z_PARTIAL_FLUSH);
        if (state == Z_STREAM_END)
        {
            break; /* XXX */
        }
        if (state == Z_DATA_ERROR)
        {
            TIFFErrorExtR(
                tif, module, "Decoding error at scanline %" PRIu32 ", %s",
                tif->tif_row, sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (state != Z_OK)
        {
            TIFFErrorExtR(tif, module, "ZLib error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
    } while (sp->stream.avail_out > 0);

    /* hopefully, we got all the bytes we needed */
    if (sp->stream.avail_out != 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32
                      " (short %u bytes)",
                      tif->tif_row, sp->stream.avail_out);
        return (0);
    }

    tif->tif_rawcp = sp->stream.next_in;
    tif->tif_rawcc = sp->stream.avail_in;

    up = sp->tbuf;
    /* Swap bytes in the data if from a different endian machine. */
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfShort(up, nsamples);

    /*
     * if llen is not an exact multiple of nsamples, the decode operation
     * may overflow the output buffer, so truncate it enough to prevent
     * that but still salvage as much data as possible.
     */
    if (nsamples % llen)
    {
        TIFFWarningExtR(tif, module,
                        "stride %d is not a multiple of sample count, "
                        "%" TIFF_SSIZE_FORMAT ", data truncated.",
                        llen, nsamples);
        nsamples -= nsamples % llen;
    }

    for (i = 0; i < nsamples; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalAccumulateF(up, llen, sp->stride, (float *)op,
                                      sp->ToLinearF);
                op += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalAccumulate16(up, llen, sp->stride, (uint16_t *)op,
                                       sp->ToLinear16);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_12BITPICIO:
                horizontalAccumulate12(up, llen, sp->stride, (int16_t *)op,
                                       sp->ToLinearF);
                op += llen * sizeof(int16_t);
                break;
            case PIXARLOGDATAFMT_11BITLOG:
                horizontalAccumulate11(up, llen, sp->stride, (uint16_t *)op);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalAccumulate8(up, llen, sp->stride, (unsigned char *)op,
                                      sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            case PIXARLOGDATAFMT_8BITABGR:
                horizontalAccumulate8abgr(up, llen, sp->stride,
                                          (unsigned char *)op, sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module, "Unsupported bits/sample: %" PRIu16,
                              td->td_bitspersample);
                return (0);
        }
    }

    return (1);
}